

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavefront.cpp
# Opt level: O1

int __thiscall WAVEFRONT::BuildMesh::GetIndex(BuildMesh *this,float *p,float *texCoord)

{
  FloatVector *this_00;
  pointer pfVar1;
  iterator iVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  int iVar6;
  
  pfVar1 = (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2._M_current =
       (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  iVar6 = (int)((ulong)((long)iVar2._M_current - (long)pfVar1) >> 2);
  iVar3 = iVar6 / 3;
  if (2 < iVar6) {
    pfVar5 = texCoord;
    if (texCoord != (float *)0x0) {
      pfVar5 = (this->mTexCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    pfVar4 = pfVar1 + 2;
    iVar6 = 0;
    do {
      if ((pfVar4[-2] == *p) && (!NAN(pfVar4[-2]) && !NAN(*p))) {
        if ((pfVar4[-1] == p[1]) && (!NAN(pfVar4[-1]) && !NAN(p[1]))) {
          if ((*pfVar4 == p[2]) && (!NAN(*pfVar4) && !NAN(p[2]))) {
            if (texCoord == (float *)0x0) {
              return iVar6;
            }
            if ((*pfVar5 == *texCoord) && (!NAN(*pfVar5) && !NAN(*texCoord))) {
              if ((pfVar5[1] == texCoord[1]) && (!NAN(pfVar5[1]) && !NAN(texCoord[1]))) {
                return iVar6;
              }
            }
          }
        }
      }
      if (pfVar5 != (float *)0x0) {
        pfVar5 = pfVar5 + 2;
      }
      iVar6 = iVar6 + 1;
      pfVar4 = pfVar4 + 3;
    } while (iVar3 != iVar6);
  }
  this_00 = &this->mVertices;
  if (iVar2._M_current ==
      (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)this_00,iVar2,p);
  }
  else {
    *iVar2._M_current = *p;
    (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)this_00,iVar2,p + 1);
  }
  else {
    *iVar2._M_current = p[1];
    (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)this_00,iVar2,p + 2);
  }
  else {
    *iVar2._M_current = p[2];
    (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  if (texCoord != (float *)0x0) {
    iVar2._M_current =
         (this->mTexCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->mTexCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)&this->mTexCoords,iVar2,texCoord);
    }
    else {
      *iVar2._M_current = *texCoord;
      (this->mTexCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    iVar2._M_current =
         (this->mTexCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->mTexCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)&this->mTexCoords,iVar2,texCoord + 1);
    }
    else {
      *iVar2._M_current = texCoord[1];
      (this->mTexCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  return iVar3;
}

Assistant:

int GetIndex(const float *p, const float *texCoord)
	{

		int vcount = (int)mVertices.size()/3;

		if(vcount>0)
		{
			//New MS STL library checks indices in debug build, so zero causes an assert if it is empty.
			const float *v = &mVertices[0];
			const float *t = texCoord != NULL ? &mTexCoords[0] : NULL;

			for (int i=0; i<vcount; i++)
			{
				if ( v[0] == p[0] && v[1] == p[1] && v[2] == p[2] )
				{
					if (texCoord == NULL || (t[0] == texCoord[0] && t[1] == texCoord[1]))
					{
						return i;
					}
				}
				v+=3;
				if (t != NULL)
					t += 2;
			}
		}

		mVertices.push_back( p[0] );
		mVertices.push_back( p[1] );
		mVertices.push_back( p[2] );

		if (texCoord != NULL)
		{
			mTexCoords.push_back( texCoord[0] );
			mTexCoords.push_back( texCoord[1] );
		}

		return vcount;
	}